

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::ScopedPrematureExitFile::ScopedPrematureExitFile
          (ScopedPrematureExitFile *this,char *premature_exit_filepath)

{
  ulong uVar1;
  FILE *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  FILE *pfile;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  local_40 = in_RSI;
  if (in_RSI == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e02e3;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffef);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    __s = (FILE *)posix::FOpen((char *)local_40,in_stack_ffffffffffffffa8);
    fwrite("0",1,1,__s);
    fclose(__s);
  }
  return;
}

Assistant:

explicit ScopedPrematureExitFile(const char* premature_exit_filepath)
      : premature_exit_filepath_(premature_exit_filepath ?
                                 premature_exit_filepath : "") {
    // If a path to the premature-exit file is specified...
    if (!premature_exit_filepath_.empty()) {
      // create the file with a single "0" character in it.  I/O
      // errors are ignored as there's nothing better we can do and we
      // don't want to fail the test because of this.
      FILE* pfile = posix::FOpen(premature_exit_filepath, "w");
      fwrite("0", 1, 1, pfile);
      fclose(pfile);
    }
  }